

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRbTree.h
# Opt level: O0

void __thiscall
highs::RbTree<HighsNodeQueue::NodeLowerRbTree>::transplant
          (RbTree<HighsNodeQueue::NodeLowerRbTree> *this,LinkType u,LinkType v,LinkType *nilParent)

{
  RbTree<HighsNodeQueue::NodeLowerRbTree> *this_00;
  undefined8 *in_RCX;
  long in_RDX;
  LinkType in_RSI;
  RbTree<HighsNodeQueue::NodeLowerRbTree> *in_RDI;
  LinkType p;
  LinkType in_stack_ffffffffffffffb8;
  RbTree<HighsNodeQueue::NodeLowerRbTree> *in_stack_ffffffffffffffc0;
  
  this_00 = (RbTree<HighsNodeQueue::NodeLowerRbTree> *)
            getParent(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (this_00 == (RbTree<HighsNodeQueue::NodeLowerRbTree> *)0xffffffffffffffff) {
    *in_RDI->rootNode = in_RDX;
  }
  else {
    in_stack_ffffffffffffffc0 = this_00;
    getChild(this_00,in_stack_ffffffffffffffb8,kLeft);
    setChild(in_RDI,in_RSI,(Dir)((ulong)in_stack_ffffffffffffffc0 >> 0x20),in_stack_ffffffffffffffb8
            );
  }
  if (in_RDX == -1) {
    *in_RCX = this_00;
  }
  else {
    setParent(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0x65eea2);
  }
  return;
}

Assistant:

void transplant(LinkType u, LinkType v, LinkType& nilParent) {
    LinkType p = getParent(u);

    if (p == kNoLink)
      rootNode = v;
    else
      setChild(p, Dir(u != getChild(p, kLeft)), v);

    if (v == kNoLink)
      nilParent = p;
    else
      setParent(v, p);
  }